

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  size_t sVar36;
  char cVar37;
  bool bVar38;
  AABBNodeMB4D *node1;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar42;
  NodeRef root;
  size_t sVar43;
  byte bVar44;
  undefined4 uVar45;
  NodeRef *pNVar46;
  uint uVar47;
  byte bVar48;
  byte bVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar69;
  vint4 bi_13;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar75;
  vint4 ai_2;
  undefined1 auVar76 [16];
  vint4 ai;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 ai_1;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  vint4 bi_1;
  undefined1 auVar86 [16];
  float fVar87;
  float fVar89;
  float fVar90;
  vint4 bi_3;
  float fVar91;
  undefined1 auVar88 [16];
  vint4 bi_2;
  vfloat4 a0;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  uint local_1904;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  int iVar52;
  int iVar70;
  int iVar71;
  int iVar72;
  
  bvh = (BVH *)This->ptr;
  sVar43 = (bvh->root).ptr;
  if (sVar43 != 8) {
    auVar60 = *(undefined1 (*) [16])(ray + 0x80);
    auVar55 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar32 = ZEXT812(0) << 0x20;
    auVar56 = ZEXT816(0) << 0x40;
    uVar13 = vcmpps_avx512vl(auVar60,auVar56,5);
    uVar50 = vpcmpeqd_avx512vl(auVar55,(undefined1  [16])valid_i->field_0);
    uVar50 = ((byte)uVar13 & 0xf) & uVar50;
    bVar48 = (byte)uVar50;
    if (bVar48 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar6 = tray.dir.field_0._32_4_;
      auVar53._0_4_ = fVar6 * fVar6;
      fVar7 = tray.dir.field_0._36_4_;
      auVar53._4_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._40_4_;
      auVar53._8_4_ = fVar8 * fVar8;
      fVar9 = tray.dir.field_0._44_4_;
      auVar53._12_4_ = fVar9 * fVar9;
      auVar54 = vfmadd231ps_fma(auVar53,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vfmadd231ps_fma(auVar54,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar53 = vrsqrt14ps_avx512vl(auVar54);
      auVar59._8_4_ = 0xbf000000;
      auVar59._0_8_ = 0xbf000000bf000000;
      auVar59._12_4_ = 0xbf000000;
      auVar54 = vmulps_avx512vl(auVar54,auVar59);
      fVar87 = auVar53._0_4_;
      fVar89 = auVar53._4_4_;
      fVar90 = auVar53._8_4_;
      fVar91 = auVar53._12_4_;
      auVar61._0_4_ = fVar87 * fVar87 * fVar87 * auVar54._0_4_;
      auVar61._4_4_ = fVar89 * fVar89 * fVar89 * auVar54._4_4_;
      auVar61._8_4_ = fVar90 * fVar90 * fVar90 * auVar54._8_4_;
      auVar61._12_4_ = fVar91 * fVar91 * fVar91 * auVar54._12_4_;
      auVar54._8_4_ = 0x3fc00000;
      auVar54._0_8_ = 0x3fc000003fc00000;
      auVar54._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar61,auVar53,auVar54);
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      uVar40 = uVar50;
      while (uVar40 != 0) {
        lVar41 = 0;
        for (uVar51 = uVar40; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
          lVar41 = lVar41 + 1;
        }
        uVar40 = uVar40 - 1 & uVar40;
        uVar51 = (ulong)(uint)((int)lVar41 * 4);
        auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar51 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar51 + 0x50)),0x1c);
        auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + uVar51 + 0x60)),0x28);
        fVar87 = *(float *)((long)pre.ray_space + (uVar51 - 0x10));
        auVar67._0_4_ = auVar54._0_4_ * fVar87;
        auVar67._4_4_ = auVar54._4_4_ * fVar87;
        auVar67._8_4_ = auVar54._8_4_ * fVar87;
        auVar67._12_4_ = auVar54._12_4_ * fVar87;
        auVar59 = vshufpd_avx(auVar67,auVar67,1);
        auVar54 = vmovshdup_avx(auVar67);
        auVar97._0_4_ = auVar54._0_4_ ^ 0x80000000;
        auVar54 = vunpckhps_avx(auVar67,auVar56);
        auVar97._4_12_ = auVar32;
        auVar61 = vshufps_avx(auVar54,auVar97,0x41);
        auVar94._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
        auVar94._8_8_ = auVar59._8_8_ ^ auVar62._8_8_;
        auVar54 = vdpps_avx(auVar61,auVar61,0x7f);
        auVar53 = vinsertps_avx(auVar94,auVar67,0x2a);
        auVar59 = vdpps_avx(auVar53,auVar53,0x7f);
        uVar13 = vcmpps_avx512vl(auVar59,auVar54,1);
        auVar54 = vpmovm2d_avx512vl(uVar13);
        auVar100._0_4_ = auVar54._0_4_;
        auVar100._4_4_ = auVar100._0_4_;
        auVar100._8_4_ = auVar100._0_4_;
        auVar100._12_4_ = auVar100._0_4_;
        uVar51 = vpmovd2m_avx512vl(auVar100);
        auVar63._4_4_ = (uint)((byte)(uVar51 >> 1) & 1) * auVar55._4_4_;
        auVar63._0_4_ = (uint)((byte)uVar51 & 1) * auVar55._0_4_;
        auVar63._8_4_ = (uint)((byte)(uVar51 >> 2) & 1) * auVar55._8_4_;
        auVar63._12_4_ = (uint)((byte)(uVar51 >> 3) & 1) * auVar55._12_4_;
        auVar54 = vblendvps_avx(auVar53,auVar61,auVar63);
        auVar59 = vdpps_avx(auVar54,auVar54,0x7f);
        auVar101._4_12_ = auVar32;
        auVar101._0_4_ = auVar59._0_4_;
        auVar53 = vrsqrt14ss_avx512f(auVar56,auVar101);
        fVar89 = auVar53._0_4_;
        fVar89 = fVar89 * 1.5 - auVar59._0_4_ * 0.5 * fVar89 * fVar89 * fVar89;
        auVar95._0_4_ = auVar54._0_4_ * fVar89;
        auVar95._4_4_ = auVar54._4_4_ * fVar89;
        auVar95._8_4_ = auVar54._8_4_ * fVar89;
        auVar95._12_4_ = auVar54._12_4_ * fVar89;
        auVar54 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar59 = vshufps_avx(auVar67,auVar67,0xc9);
        auVar102._0_4_ = auVar95._0_4_ * auVar59._0_4_;
        auVar102._4_4_ = auVar95._4_4_ * auVar59._4_4_;
        auVar102._8_4_ = auVar95._8_4_ * auVar59._8_4_;
        auVar102._12_4_ = auVar95._12_4_ * auVar59._12_4_;
        auVar54 = vfmsub231ps_fma(auVar102,auVar67,auVar54);
        auVar59 = vshufps_avx(auVar54,auVar54,0xc9);
        auVar54 = vdpps_avx(auVar59,auVar59,0x7f);
        auVar103._4_12_ = auVar32;
        auVar103._0_4_ = auVar54._0_4_;
        auVar53 = vrsqrt14ss_avx512f(auVar56,auVar103);
        fVar89 = auVar53._0_4_;
        fVar89 = fVar89 * 1.5 - auVar54._0_4_ * 0.5 * fVar89 * fVar89 * fVar89;
        auVar98._0_4_ = fVar89 * auVar59._0_4_;
        auVar98._4_4_ = fVar89 * auVar59._4_4_;
        auVar98._8_4_ = fVar89 * auVar59._8_4_;
        auVar98._12_4_ = fVar89 * auVar59._12_4_;
        auVar68._0_4_ = fVar87 * auVar67._0_4_;
        auVar68._4_4_ = fVar87 * auVar67._4_4_;
        auVar68._8_4_ = fVar87 * auVar67._8_4_;
        auVar68._12_4_ = fVar87 * auVar67._12_4_;
        auVar53 = vunpcklps_avx(auVar95,auVar68);
        auVar54 = vunpckhps_avx(auVar95,auVar68);
        auVar61 = vunpcklps_avx(auVar98,auVar56);
        auVar59 = vunpckhps_avx(auVar98,auVar56);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar54,auVar59);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar61);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar53,auVar61);
        pre.ray_space[lVar41].vx.field_0 = aVar12;
        pre.ray_space[lVar41].vy.field_0 = aVar10;
        pre.ray_space[lVar41].vz.field_0 = aVar11;
      }
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar106 = ZEXT1664(auVar55);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar107 = ZEXT1664(auVar56);
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar55);
      uVar40 = vcmpps_avx512vl(auVar54,auVar56,1);
      bVar38 = (bool)((byte)uVar40 & 1);
      iVar52 = auVar56._0_4_;
      auVar57._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * tray.dir.field_0._0_4_;
      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
      iVar70 = auVar56._4_4_;
      auVar57._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * tray.dir.field_0._4_4_;
      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
      iVar71 = auVar56._8_4_;
      iVar72 = auVar56._12_4_;
      auVar57._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * tray.dir.field_0._8_4_;
      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * tray.dir.field_0._12_4_;
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar55);
      uVar40 = vcmpps_avx512vl(auVar54,auVar56,1);
      bVar38 = (bool)((byte)uVar40 & 1);
      auVar58._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * tray.dir.field_0._16_4_;
      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * tray.dir.field_0._20_4_;
      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * tray.dir.field_0._24_4_;
      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar58._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * tray.dir.field_0._28_4_;
      auVar55 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar55);
      uVar40 = vcmpps_avx512vl(auVar55,auVar56,1);
      bVar38 = (bool)((byte)uVar40 & 1);
      auVar55._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * (int)fVar6;
      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * (int)fVar7;
      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * (int)fVar8;
      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar55._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * (int)fVar9;
      auVar56 = vrcp14ps_avx512vl(auVar57);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108 = ZEXT1664(auVar54);
      auVar59 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar109 = ZEXT1664(auVar59);
      auVar53 = vfnmadd213ps_avx512vl(auVar57,auVar56,auVar54);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar56,auVar56)
      ;
      auVar56 = vrcp14ps_avx512vl(auVar58);
      auVar53 = vfnmadd213ps_avx512vl(auVar58,auVar56,auVar54);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar56,auVar56)
      ;
      auVar56 = vrcp14ps_avx512vl(auVar55);
      auVar55 = vfnmadd213ps_avx512vl(auVar55,auVar56,auVar54);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar56,auVar56)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar59,1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar59,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar38 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar38 * auVar55._0_4_ | (uint)!bVar38 * 0x30;
      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * 0x30;
      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * 0x30;
      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * 0x30;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar59,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar38 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar38 * auVar55._0_4_ | (uint)!bVar38 * 0x50;
      bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * 0x50;
      bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * 0x50;
      bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar110 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar59);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar48 & 1) * auVar55._0_4_ |
           (uint)!(bool)(bVar48 & 1) * stack_near[0].field_0._0_4_;
      bVar38 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * stack_near[0].field_0._4_4_;
      bVar38 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * stack_near[0].field_0._8_4_;
      bVar38 = SUB81(uVar50 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * stack_near[0].field_0._12_4_;
      auVar60 = vmaxps_avx512vl(auVar60,auVar59);
      tray.tfar.field_0.i[0] =
           (uint)(bVar48 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar48 & 1) * -0x800000;
      bVar38 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar38 * auVar60._4_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar38 * auVar60._8_4_ | (uint)!bVar38 * -0x800000;
      bVar38 = SUB81(uVar50 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar38 * auVar60._12_4_ | (uint)!bVar38 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar47 = 3;
      }
      else {
        uVar47 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1904 = (ushort)uVar50 ^ 0xf;
      pNVar46 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar42 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar43;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01c9cb15:
      do {
        do {
          root.ptr = pNVar46[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9d1b9;
          pNVar46 = pNVar46 + -1;
          vVar1.field_0 =
               *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                ((vfloat<4> *)paVar42)[-1].field_0.v;
          auVar111 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar42 = &((vfloat<4> *)paVar42)[-1].field_0;
          uVar50 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar50 == '\0');
        uVar45 = (undefined4)uVar50;
        if (uVar47 < (uint)POPCOUNT(uVar45)) {
LAB_01c9cb5e:
          do {
            lVar41 = -0x10;
            sVar43 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9d1b9;
              uVar13 = vcmpps_avx512vl(auVar111._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar13 != '\0') {
                bVar49 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar3 = This->leafIntersector;
                uVar50 = (ulong)(~(byte)local_1904 & 0xf);
                bVar44 = 0;
                while (uVar50 != 0) {
                  lVar41 = 0;
                  for (uVar40 = uVar50; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar50 = uVar50 - 1 & uVar50;
                  cVar37 = (**(code **)((long)pvVar3 + (ulong)bVar49 * 0x40 + 0x18))
                                     (&pre,ray,lVar41,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar31 = (byte)(1 << ((uint)lVar41 & 0x1f));
                  if (cVar37 == '\0') {
                    bVar31 = 0;
                  }
                  bVar44 = bVar44 | bVar31;
                }
                bVar44 = (byte)local_1904 | bVar44;
                local_1904 = (uint)bVar44;
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar106 = ZEXT1664(auVar60);
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar107 = ZEXT1664(auVar60);
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar108 = ZEXT1664(auVar60);
                auVar60 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
                auVar109 = ZEXT1664(auVar60);
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar110 = ZEXT1664(auVar60);
                if (bVar44 == 0xf) {
                  local_1904._0_1_ = 0xf;
                  goto LAB_01c9d1b9;
                }
                auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar38 = (bool)(bVar44 >> 1 & 1);
                bVar4 = (bool)(bVar44 >> 2 & 1);
                bVar5 = (bool)(bVar44 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar38 * auVar60._4_4_ | (uint)!bVar38 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar44 & 1) * auVar60._0_4_ |
                     (uint)!(bool)(bVar44 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar4 * auVar60._8_4_ | (uint)!bVar4 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar5 * auVar60._12_4_ | (uint)!bVar5 * tray.tfar.field_0.i[3];
              }
              goto LAB_01c9cb15;
            }
            uVar13 = vcmpps_avx512vl(auVar111._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar50 = root.ptr & 0xfffffffffffffff0;
            uVar39 = (uint)root.ptr & 7;
            aVar75 = auVar110._0_16_;
            for (; (auVar111 = ZEXT1664((undefined1  [16])aVar75), lVar41 != 0 &&
                   (sVar2 = *(size_t *)(uVar50 + 0x20 + lVar41 * 2), sVar2 != 8));
                lVar41 = lVar41 + 4) {
              if ((uVar39 == 6) || (uVar39 == 1)) {
                uVar45 = *(undefined4 *)(uVar50 + 0x90 + lVar41);
                auVar77._4_4_ = uVar45;
                auVar77._0_4_ = uVar45;
                auVar77._8_4_ = uVar45;
                auVar77._12_4_ = uVar45;
                auVar60 = *(undefined1 (*) [16])(ray + 0x70);
                uVar45 = *(undefined4 *)(uVar50 + 0x30 + lVar41);
                auVar56._4_4_ = uVar45;
                auVar56._0_4_ = uVar45;
                auVar56._8_4_ = uVar45;
                auVar56._12_4_ = uVar45;
                auVar55 = vfmadd213ps_avx512vl(auVar77,auVar60,auVar56);
                uVar45 = *(undefined4 *)(uVar50 + 0xb0 + lVar41);
                auVar79._4_4_ = uVar45;
                auVar79._0_4_ = uVar45;
                auVar79._8_4_ = uVar45;
                auVar79._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x50 + lVar41);
                auVar16._4_4_ = uVar45;
                auVar16._0_4_ = uVar45;
                auVar16._8_4_ = uVar45;
                auVar16._12_4_ = uVar45;
                auVar56 = vfmadd213ps_avx512vl(auVar79,auVar60,auVar16);
                uVar45 = *(undefined4 *)(uVar50 + 0xd0 + lVar41);
                auVar81._4_4_ = uVar45;
                auVar81._0_4_ = uVar45;
                auVar81._8_4_ = uVar45;
                auVar81._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x70 + lVar41);
                auVar17._4_4_ = uVar45;
                auVar17._0_4_ = uVar45;
                auVar17._8_4_ = uVar45;
                auVar17._12_4_ = uVar45;
                auVar53 = vfmadd213ps_avx512vl(auVar81,auVar60,auVar17);
                uVar45 = *(undefined4 *)(uVar50 + 0xa0 + lVar41);
                auVar83._4_4_ = uVar45;
                auVar83._0_4_ = uVar45;
                auVar83._8_4_ = uVar45;
                auVar83._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x40 + lVar41);
                auVar18._4_4_ = uVar45;
                auVar18._0_4_ = uVar45;
                auVar18._8_4_ = uVar45;
                auVar18._12_4_ = uVar45;
                auVar61 = vfmadd213ps_avx512vl(auVar83,auVar60,auVar18);
                uVar45 = *(undefined4 *)(uVar50 + 0xc0 + lVar41);
                auVar86._4_4_ = uVar45;
                auVar86._0_4_ = uVar45;
                auVar86._8_4_ = uVar45;
                auVar86._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x60 + lVar41);
                auVar19._4_4_ = uVar45;
                auVar19._0_4_ = uVar45;
                auVar19._8_4_ = uVar45;
                auVar19._12_4_ = uVar45;
                auVar62 = vfmadd213ps_avx512vl(auVar86,auVar60,auVar19);
                uVar45 = *(undefined4 *)(uVar50 + 0xe0 + lVar41);
                auVar88._4_4_ = uVar45;
                auVar88._0_4_ = uVar45;
                auVar88._8_4_ = uVar45;
                auVar88._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x80 + lVar41);
                auVar20._4_4_ = uVar45;
                auVar20._0_4_ = uVar45;
                auVar20._8_4_ = uVar45;
                auVar20._12_4_ = uVar45;
                auVar63 = vfmadd213ps_avx512vl(auVar88,auVar60,auVar20);
                auVar54 = vfmsub213ps_fma(auVar55,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0)
                ;
                auVar59 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0)
                ;
                auVar53 = vfmsub213ps_fma(auVar53,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar61 = vfmsub213ps_fma(auVar61,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0)
                ;
                auVar62 = vfmsub213ps_fma(auVar62,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0)
                ;
                auVar63 = vfmsub213ps_fma(auVar63,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0)
                ;
                auVar55 = vpminsd_avx(auVar54,auVar61);
                auVar56 = vpminsd_avx(auVar59,auVar62);
                auVar55 = vpmaxsd_avx(auVar55,auVar56);
                auVar56 = vpminsd_avx(auVar53,auVar63);
                auVar55 = vpmaxsd_avx(auVar55,auVar56);
                auVar56 = vpmaxsd_avx(auVar54,auVar61);
                auVar54 = vpmaxsd_avx(auVar59,auVar62);
                auVar54 = vpminsd_avx(auVar56,auVar54);
                auVar56 = vpmaxsd_avx(auVar53,auVar63);
                auVar54 = vpminsd_avx(auVar54,auVar56);
                auVar56 = vpmaxsd_avx(auVar55,(undefined1  [16])tray.tnear.field_0);
                auVar54 = vpminsd_avx(auVar54,(undefined1  [16])tray.tfar.field_0);
                uVar14 = vcmpps_avx512vl(auVar56,auVar54,2);
                bVar49 = (byte)uVar14;
                if (uVar39 == 6) {
                  uVar45 = *(undefined4 *)(uVar50 + 0x100 + lVar41);
                  auVar21._4_4_ = uVar45;
                  auVar21._0_4_ = uVar45;
                  auVar21._8_4_ = uVar45;
                  auVar21._12_4_ = uVar45;
                  uVar14 = vcmpps_avx512vl(auVar60,auVar21,1);
                  uVar45 = *(undefined4 *)(uVar50 + 0xf0 + lVar41);
                  auVar22._4_4_ = uVar45;
                  auVar22._0_4_ = uVar45;
                  auVar22._8_4_ = uVar45;
                  auVar22._12_4_ = uVar45;
                  uVar15 = vcmpps_avx512vl(auVar60,auVar22,0xd);
                  bVar49 = (byte)uVar14 & (byte)uVar15 & bVar49;
                }
              }
              else {
                uVar45 = *(undefined4 *)(uVar50 + 0x30 + lVar41);
                auVar84._4_4_ = uVar45;
                auVar84._0_4_ = uVar45;
                auVar84._8_4_ = uVar45;
                auVar84._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x40 + lVar41);
                auVar82._4_4_ = uVar45;
                auVar82._0_4_ = uVar45;
                auVar82._8_4_ = uVar45;
                auVar82._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x50 + lVar41);
                auVar80._4_4_ = uVar45;
                auVar80._0_4_ = uVar45;
                auVar80._8_4_ = uVar45;
                auVar80._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x60 + lVar41);
                auVar96._4_4_ = uVar45;
                auVar96._0_4_ = uVar45;
                auVar96._8_4_ = uVar45;
                auVar96._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x70 + lVar41);
                auVar93._4_4_ = uVar45;
                auVar93._0_4_ = uVar45;
                auVar93._8_4_ = uVar45;
                auVar93._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x80 + lVar41);
                auVar92._4_4_ = uVar45;
                auVar92._0_4_ = uVar45;
                auVar92._8_4_ = uVar45;
                auVar92._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0x90 + lVar41);
                auVar78._4_4_ = uVar45;
                auVar78._0_4_ = uVar45;
                auVar78._8_4_ = uVar45;
                auVar78._12_4_ = uVar45;
                uVar45 = *(undefined4 *)(uVar50 + 0xa0 + lVar41);
                auVar76._4_4_ = uVar45;
                auVar76._0_4_ = uVar45;
                auVar76._8_4_ = uVar45;
                auVar76._12_4_ = uVar45;
                fVar6 = *(float *)(uVar50 + 0xb0 + lVar41);
                auVar73._4_4_ = fVar6;
                auVar73._0_4_ = fVar6;
                auVar73._8_4_ = fVar6;
                auVar73._12_4_ = fVar6;
                auVar60 = *(undefined1 (*) [16])(ray + 0x70);
                auVar68 = auVar108._0_16_;
                auVar55 = vsubps_avx512vl(auVar68,auVar60);
                uVar45 = *(undefined4 *)(uVar50 + 0xf0 + lVar41);
                auVar23._4_4_ = uVar45;
                auVar23._0_4_ = uVar45;
                auVar23._8_4_ = uVar45;
                auVar23._12_4_ = uVar45;
                auVar56 = vmulps_avx512vl(auVar60,auVar23);
                uVar45 = *(undefined4 *)(uVar50 + 0x100 + lVar41);
                auVar24._4_4_ = uVar45;
                auVar24._0_4_ = uVar45;
                auVar24._8_4_ = uVar45;
                auVar24._12_4_ = uVar45;
                auVar54 = vmulps_avx512vl(auVar60,auVar24);
                uVar45 = *(undefined4 *)(uVar50 + 0x110 + lVar41);
                auVar25._4_4_ = uVar45;
                auVar25._0_4_ = uVar45;
                auVar25._8_4_ = uVar45;
                auVar25._12_4_ = uVar45;
                auVar59 = vmulps_avx512vl(auVar60,auVar25);
                auVar62 = auVar109._0_16_;
                auVar56 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar62);
                auVar54 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar62);
                uVar45 = *(undefined4 *)(uVar50 + 0x120 + lVar41);
                auVar26._4_4_ = uVar45;
                auVar26._0_4_ = uVar45;
                auVar26._8_4_ = uVar45;
                auVar26._12_4_ = uVar45;
                auVar53 = vmulps_avx512vl(auVar60,auVar26);
                uVar45 = *(undefined4 *)(uVar50 + 0x130 + lVar41);
                auVar27._4_4_ = uVar45;
                auVar27._0_4_ = uVar45;
                auVar27._8_4_ = uVar45;
                auVar27._12_4_ = uVar45;
                auVar61 = vmulps_avx512vl(auVar60,auVar27);
                auVar59 = vfmadd231ps_avx512vl(auVar59,auVar55,auVar62);
                uVar45 = *(undefined4 *)(uVar50 + 0x140 + lVar41);
                auVar28._4_4_ = uVar45;
                auVar28._0_4_ = uVar45;
                auVar28._8_4_ = uVar45;
                auVar28._12_4_ = uVar45;
                auVar60 = vmulps_avx512vl(auVar60,auVar28);
                auVar104._0_4_ = auVar55._0_4_ + auVar53._0_4_;
                auVar104._4_4_ = auVar55._4_4_ + auVar53._4_4_;
                auVar104._8_4_ = auVar55._8_4_ + auVar53._8_4_;
                auVar104._12_4_ = auVar55._12_4_ + auVar53._12_4_;
                auVar53 = vaddps_avx512vl(auVar55,auVar61);
                auVar99._0_4_ = auVar55._0_4_ + auVar60._0_4_;
                auVar99._4_4_ = auVar55._4_4_ + auVar60._4_4_;
                auVar99._8_4_ = auVar55._8_4_ + auVar60._8_4_;
                auVar99._12_4_ = auVar55._12_4_ + auVar60._12_4_;
                auVar33._4_4_ = tray.org.field_0._4_4_;
                auVar33._0_4_ = tray.org.field_0._0_4_;
                auVar33._8_4_ = tray.org.field_0._8_4_;
                auVar33._12_4_ = tray.org.field_0._12_4_;
                auVar34._4_4_ = tray.org.field_0._20_4_;
                auVar34._0_4_ = tray.org.field_0._16_4_;
                auVar34._8_4_ = tray.org.field_0._24_4_;
                auVar34._12_4_ = tray.org.field_0._28_4_;
                auVar35._4_4_ = tray.org.field_0._36_4_;
                auVar35._0_4_ = tray.org.field_0._32_4_;
                auVar35._8_4_ = tray.org.field_0._40_4_;
                auVar35._12_4_ = tray.org.field_0._44_4_;
                auVar60 = vmulps_avx512vl(auVar78,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar55 = vmulps_avx512vl(auVar76,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar105._0_4_ = tray.dir.field_0._32_4_ * fVar6;
                auVar105._4_4_ = tray.dir.field_0._36_4_ * fVar6;
                auVar105._8_4_ = tray.dir.field_0._40_4_ * fVar6;
                auVar105._12_4_ = tray.dir.field_0._44_4_ * fVar6;
                auVar60 = vfmadd231ps_avx512vl
                                    (auVar60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar96);
                auVar55 = vfmadd231ps_avx512vl
                                    (auVar55,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar93);
                auVar61 = vfmadd231ps_avx512vl
                                    (auVar105,auVar92,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar60 = vfmadd231ps_avx512vl
                                    (auVar60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar84);
                auVar55 = vfmadd231ps_avx512vl
                                    (auVar55,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar82);
                auVar61 = vfmadd231ps_avx512vl
                                    (auVar61,auVar80,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar63 = auVar106._0_16_;
                auVar62 = vandps_avx512vl(auVar60,auVar63);
                auVar67 = auVar107._0_16_;
                uVar40 = vcmpps_avx512vl(auVar62,auVar67,1);
                bVar38 = (bool)((byte)uVar40 & 1);
                iVar52 = auVar107._0_4_;
                auVar64._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * auVar60._0_4_;
                bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                iVar70 = auVar107._4_4_;
                auVar64._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * auVar60._4_4_;
                bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                iVar71 = auVar107._8_4_;
                iVar72 = auVar107._12_4_;
                auVar64._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * auVar60._8_4_;
                bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar64._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * auVar60._12_4_;
                auVar60 = vandps_avx512vl(auVar55,auVar63);
                uVar40 = vcmpps_avx512vl(auVar60,auVar67,1);
                bVar38 = (bool)((byte)uVar40 & 1);
                auVar65._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * auVar55._0_4_;
                bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * auVar55._4_4_;
                bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * auVar55._8_4_;
                bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar65._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * auVar55._12_4_;
                auVar60 = vandps_avx512vl(auVar61,auVar63);
                uVar40 = vcmpps_avx512vl(auVar60,auVar67,1);
                bVar38 = (bool)((byte)uVar40 & 1);
                auVar66._0_4_ = (uint)bVar38 * iVar52 | (uint)!bVar38 * auVar61._0_4_;
                bVar38 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar38 * iVar70 | (uint)!bVar38 * auVar61._4_4_;
                bVar38 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar38 * iVar71 | (uint)!bVar38 * auVar61._8_4_;
                bVar38 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar66._12_4_ = (uint)bVar38 * iVar72 | (uint)!bVar38 * auVar61._12_4_;
                auVar60 = vrcp14ps_avx512vl(auVar64);
                auVar55 = vfnmadd213ps_avx512vl(auVar64,auVar60,auVar68);
                auVar55 = vfmadd132ps_avx512vl(auVar55,auVar60,auVar60);
                auVar60 = vrcp14ps_avx512vl(auVar65);
                auVar61 = vfnmadd213ps_avx512vl(auVar65,auVar60,auVar68);
                auVar61 = vfmadd132ps_avx512vl(auVar61,auVar60,auVar60);
                auVar62 = vrcp14ps_avx512vl(auVar66);
                auVar63 = vfnmadd213ps_avx512vl(auVar66,auVar62,auVar68);
                uVar45 = *(undefined4 *)(uVar50 + 0xc0 + lVar41);
                auVar60._4_4_ = uVar45;
                auVar60._0_4_ = uVar45;
                auVar60._8_4_ = uVar45;
                auVar60._12_4_ = uVar45;
                auVar60 = vfmadd213ps_avx512vl(auVar78,auVar35,auVar60);
                uVar45 = *(undefined4 *)(uVar50 + 0xd0 + lVar41);
                auVar29._4_4_ = uVar45;
                auVar29._0_4_ = uVar45;
                auVar29._8_4_ = uVar45;
                auVar29._12_4_ = uVar45;
                auVar67 = vfmadd213ps_avx512vl(auVar76,auVar35,auVar29);
                auVar62 = vfmadd132ps_avx512vl(auVar63,auVar62,auVar62);
                uVar45 = *(undefined4 *)(uVar50 + 0xe0 + lVar41);
                auVar30._4_4_ = uVar45;
                auVar30._0_4_ = uVar45;
                auVar30._8_4_ = uVar45;
                auVar30._12_4_ = uVar45;
                auVar63 = vfmadd213ps_avx512vl(auVar73,auVar35,auVar30);
                auVar60 = vfmadd231ps_avx512vl(auVar60,auVar34,auVar96);
                auVar67 = vfmadd231ps_avx512vl(auVar67,auVar34,auVar93);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar34,auVar92);
                auVar68 = vfmadd231ps_avx512vl(auVar60,auVar33,auVar84);
                auVar67 = vfmadd231ps_avx512vl(auVar67,auVar33,auVar82);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar33,auVar80);
                auVar60 = vsubps_avx(auVar56,auVar68);
                auVar56 = vmulps_avx512vl(auVar55,auVar60);
                auVar60 = vsubps_avx(auVar54,auVar67);
                auVar54 = vmulps_avx512vl(auVar61,auVar60);
                auVar60 = vsubps_avx(auVar59,auVar63);
                auVar85._0_4_ = auVar62._0_4_ * auVar60._0_4_;
                auVar85._4_4_ = auVar62._4_4_ * auVar60._4_4_;
                auVar85._8_4_ = auVar62._8_4_ * auVar60._8_4_;
                auVar85._12_4_ = auVar62._12_4_ * auVar60._12_4_;
                auVar60 = vsubps_avx(auVar104,auVar68);
                auVar59 = vmulps_avx512vl(auVar55,auVar60);
                auVar60 = vsubps_avx(auVar53,auVar67);
                auVar53 = vmulps_avx512vl(auVar61,auVar60);
                auVar60 = vsubps_avx(auVar99,auVar63);
                auVar74._0_4_ = auVar62._0_4_ * auVar60._0_4_;
                auVar74._4_4_ = auVar62._4_4_ * auVar60._4_4_;
                auVar74._8_4_ = auVar62._8_4_ * auVar60._8_4_;
                auVar74._12_4_ = auVar62._12_4_ * auVar60._12_4_;
                auVar60 = vpminsd_avx(auVar56,auVar59);
                auVar55 = vpminsd_avx(auVar54,auVar53);
                auVar60 = vpmaxsd_avx(auVar60,auVar55);
                auVar55 = vpminsd_avx(auVar85,auVar74);
                auVar55 = vpmaxsd_avx(auVar60,auVar55);
                auVar60 = vpmaxsd_avx(auVar56,auVar59);
                auVar56 = vpmaxsd_avx(auVar54,auVar53);
                auVar56 = vpminsd_avx(auVar60,auVar56);
                auVar60 = vpmaxsd_avx(auVar85,auVar74);
                auVar60 = vpminsd_avx(auVar56,auVar60);
                auVar56 = vpmaxsd_avx(auVar55,(undefined1  [16])tray.tnear.field_0);
                auVar60 = vpminsd_avx(auVar60,(undefined1  [16])tray.tfar.field_0);
                uVar14 = vcmpps_avx512vl(auVar56,auVar60,2);
                bVar49 = (byte)uVar14;
              }
              bVar49 = bVar49 & (byte)uVar13;
              sVar36 = sVar43;
              aVar69 = aVar75;
              if (bVar49 != 0) {
                auVar55 = vblendmps_avx512vl((undefined1  [16])auVar110._0_16_,auVar55);
                aVar69._0_4_ = (uint)(bVar49 & 1) * auVar55._0_4_ |
                               (uint)!(bool)(bVar49 & 1) * auVar60._0_4_;
                bVar38 = (bool)(bVar49 >> 1 & 1);
                aVar69._4_4_ = (uint)bVar38 * auVar55._4_4_ | (uint)!bVar38 * auVar60._4_4_;
                bVar38 = (bool)(bVar49 >> 2 & 1);
                aVar69._8_4_ = (uint)bVar38 * auVar55._8_4_ | (uint)!bVar38 * auVar60._8_4_;
                bVar38 = (bool)(bVar49 >> 3 & 1);
                aVar69._12_4_ = (uint)bVar38 * auVar55._12_4_ | (uint)!bVar38 * auVar60._12_4_;
                sVar36 = sVar2;
                if (sVar43 != 8) {
                  pNVar46->ptr = sVar43;
                  pNVar46 = pNVar46 + 1;
                  *paVar42 = aVar75;
                  paVar42 = paVar42 + 1;
                }
              }
              aVar75 = aVar69;
              sVar43 = sVar36;
            }
            if (sVar43 == 8) goto LAB_01c9cf9b;
            uVar13 = vcmpps_avx512vl((undefined1  [16])aVar75,(undefined1  [16])tray.tfar.field_0,9)
            ;
            root.ptr = sVar43;
          } while ((byte)uVar47 < (byte)POPCOUNT((int)uVar13));
          pNVar46->ptr = sVar43;
          pNVar46 = pNVar46 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar42->v = aVar75;
          paVar42 = paVar42 + 1;
LAB_01c9cf9b:
          iVar52 = 4;
        }
        else {
          while (uVar50 != 0) {
            sVar43 = 0;
            for (uVar40 = uVar50; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              sVar43 = sVar43 + 1;
            }
            uVar50 = uVar50 - 1 & uVar50;
            bVar38 = occluded1(This,bvh,root,sVar43,&pre,ray,&tray,context);
            bVar49 = (byte)(1 << ((uint)sVar43 & 0x1f));
            if (!bVar38) {
              bVar49 = 0;
            }
            local_1904 = (uint)((byte)local_1904 | bVar49);
          }
          iVar52 = 3;
          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar106 = ZEXT1664(auVar60);
          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar107 = ZEXT1664(auVar60);
          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar108 = ZEXT1664(auVar60);
          auVar60 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
          auVar109 = ZEXT1664(auVar60);
          auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar110 = ZEXT1664(auVar60);
          auVar111 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((byte)local_1904 != 0xf) {
            auVar60 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1904 & 1) * auVar60._0_4_ |
                 (uint)!(bool)((byte)local_1904 & 1) * tray.tfar.field_0.i[0];
            bVar38 = (bool)((byte)(local_1904 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar38 * auVar60._4_4_ | (uint)!bVar38 * tray.tfar.field_0.i[1];
            bVar38 = (bool)((byte)(local_1904 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar38 * auVar60._8_4_ | (uint)!bVar38 * tray.tfar.field_0.i[2];
            bVar38 = (bool)((byte)(local_1904 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar38 * auVar60._12_4_ | (uint)!bVar38 * tray.tfar.field_0.i[3];
            iVar52 = 2;
          }
          if (uVar47 < (uint)POPCOUNT(uVar45)) goto LAB_01c9cb5e;
        }
        if (iVar52 == 3) {
LAB_01c9d1b9:
          local_1904._0_1_ = (byte)local_1904 & bVar48;
          bVar38 = (bool)((byte)local_1904 >> 1 & 1);
          bVar4 = (bool)((byte)local_1904 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)((byte)local_1904 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_1904 & 1) * *(int *)(ray + 0x80);
          *(uint *)(ray + 0x84) = (uint)bVar38 * -0x800000 | (uint)!bVar38 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_1904 >> 3) * -0x800000 |
               (uint)!(bool)((byte)local_1904 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }